

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_y_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  uint16_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t res;
  int x;
  int y;
  int in_stack_ffffffffffffffcc;
  undefined4 local_2c;
  undefined4 local_28;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
      uVar1 = clip_pixel_highbd((uint)*(ushort *)(local_8 + (long)local_2c * 2) +
                                (uint)*(ushort *)(local_8 + (long)(in_ESI + local_2c) * 2),
                                in_stack_ffffffffffffffcc);
      *(uint16_t *)(local_18 + (long)local_2c * 2) = uVar1;
    }
    local_8 = local_8 + (long)in_ESI * 2;
    local_18 = local_18 + (long)in_ECX * 2;
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    int bd) {
  assert(subpel_y_qn == 8);
  assert(filter_params_y->taps == 2);
  (void)filter_params_y;
  (void)subpel_y_qn;

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[src_stride + x];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, 1), bd);
    }
    src += src_stride;
    dst += dst_stride;
  }
}